

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O3

nbt_status dump_string_binary(char *name,buffer *b)

{
  int iVar1;
  nbt_status nVar2;
  size_t n;
  ushort local_1a;
  
  if (name != (char *)0x0) {
    n = strlen(name);
    nVar2 = NBT_ERR;
    if (n < 0x8000) {
      local_1a = (ushort)n << 8 | (ushort)n >> 8;
      iVar1 = buffer_append(b,&local_1a,2);
      nVar2 = NBT_EMEM;
      if (iVar1 == 0) {
        iVar1 = buffer_append(b,name,n);
        nVar2 = (uint)(iVar1 == 0) * 2 + NBT_EMEM;
      }
    }
    return nVar2;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_parsing.c",
                0x2b1,"nbt_status dump_string_binary(const char *, struct buffer *)");
}

Assistant:

static nbt_status dump_string_binary(const char* name, struct buffer* b)
{
    assert(name);

    size_t len = strlen(name);

    if(len > 32767 /* SHORT_MAX */)
        return NBT_ERR;

    { /* dump the length */
        int16_t dumped_len = (int16_t)len;
        ne2be(&dumped_len, sizeof dumped_len);

        CHECKED_APPEND(b, &dumped_len, sizeof dumped_len);
    }

    CHECKED_APPEND(b, name, len);

    return NBT_OK;
}